

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O0

FString CalcMapName(int episode,int level)

{
  FString *pFVar1;
  uint in_EDX;
  undefined4 in_register_0000003c;
  FString *this;
  int level_local;
  int episode_local;
  FString *lumpname;
  
  this = (FString *)CONCAT44(in_register_0000003c,episode);
  FString::FString(this);
  if ((gameinfo.flags & 1U) == 0) {
    FString::operator=(this,"");
    pFVar1 = FString::operator<<(this,'E');
    pFVar1 = FString::operator<<(pFVar1,(char)level + '0');
    pFVar1 = FString::operator<<(pFVar1,'M');
    FString::operator<<(pFVar1,(char)in_EDX + '0');
  }
  else {
    FString::Format(this,"MAP%02d",(ulong)in_EDX);
  }
  return (FString)(char *)this;
}

Assistant:

FString CalcMapName (int episode, int level)
{
	FString lumpname;

	if (gameinfo.flags & GI_MAPxx)
	{
		lumpname.Format("MAP%02d", level);
	}
	else
	{
		lumpname = "";
		lumpname << 'E' << ('0' + episode) << 'M' << ('0' + level);
	}
	return lumpname;
}